

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswInt.h
# Opt level: O2

Aig_Obj_t * Csw_ObjChild0Equiv(Csw_Man_t *p,Aig_Obj_t *pObj)

{
  ulong uVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswInt.h"
                  ,0x74,"Aig_Obj_t *Csw_ObjChild0Equiv(Csw_Man_t *, Aig_Obj_t *)");
  }
  uVar1 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
  if (uVar1 != 0) {
    return (Aig_Obj_t *)
           ((ulong)((uint)pObj->pFanin0 & 1) ^ (ulong)p->pEquiv[*(int *)(uVar1 + 0x24)]);
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

static inline Aig_Obj_t *  Csw_ObjChild0Equiv( Csw_Man_t * p, Aig_Obj_t * pObj ) { assert( !Aig_IsComplement(pObj) ); return Aig_ObjFanin0(pObj)? Aig_NotCond(Csw_ObjEquiv(p, Aig_ObjFanin0(pObj)), Aig_ObjFaninC0(pObj)) : NULL;  }